

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_compile(HSQUIRRELVM v,SQLEXREADFUNC read,SQUserPointer p,SQChar *sourcename,
                   SQBool raiseerror)

{
  SQSharedState *ss;
  bool bVar1;
  SQWeakRef *root;
  SQClosure *x;
  SQObjectPtr local_68 [2];
  undefined1 local_48 [8];
  SQObjectPtr o;
  SQBool raiseerror_local;
  SQChar *sourcename_local;
  SQUserPointer p_local;
  SQLEXREADFUNC read_local;
  HSQUIRRELVM v_local;
  
  o.super_SQObject._unVal = (SQObjectValue)raiseerror;
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_48);
  bVar1 = Compile(v,read,p,sourcename,(SQObjectPtr *)local_48,
                  o.super_SQObject._unVal.pTable != (SQTable *)0x0,
                  (bool)(v->_sharedstate->_debuginfo & 1));
  if (bVar1) {
    ss = v->_sharedstate;
    root = SQRefCounted::GetWeakRef((v->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
    x = SQClosure::Create(ss,(SQFunctionProto *)o.super_SQObject._0_8_,root);
    SQObjectPtr::SQObjectPtr(local_68,x);
    SQVM::Push(v,local_68);
    SQObjectPtr::~SQObjectPtr(local_68);
    v_local = (HSQUIRRELVM)0x0;
  }
  else {
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_48);
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_compile(HSQUIRRELVM v,SQLEXREADFUNC read,SQUserPointer p,const SQChar *sourcename,SQBool raiseerror)
{
    SQObjectPtr o;
#ifndef NO_COMPILER
    if(Compile(v, read, p, sourcename, o, raiseerror?true:false, _ss(v)->_debuginfo)) {
        v->Push(SQClosure::Create(_ss(v), _funcproto(o), _table(v->_roottable)->GetWeakRef(OT_TABLE)));
        return SQ_OK;
    }
    return SQ_ERROR;
#else
    return sq_throwerror(v,_SC("this is a no compiler build"));
#endif
}